

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack22_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3fffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x16;
  *puVar1 = (in[1] & 0xfff) << 10 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0xc;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 3) << 0x14 | *puVar1;
  out[3] = *puVar2 >> 2 & 0x3fffff;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[3] & 0x3fff) << 8 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[3] >> 0xe;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0xf) << 0x12 | *puVar1;
  out[6] = *puVar2 >> 4 & 0x3fffff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1a;
  *puVar1 = (in[5] & 0xffff) << 6 | *puVar1;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack22_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;

  return in + 1;
}